

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

int __thiscall zmq::context_t::close(context_t *this,int __fd)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int rc;
  
  if (this->ptr != (void *)0x0) {
    do {
      iVar1 = zmq_ctx_destroy(this->ptr);
      bVar3 = false;
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    this->ptr = (void *)0x0;
  }
  return (int)this;
}

Assistant:

void close() ZMQ_NOTHROW
    {
        if (ptr == ZMQ_NULLPTR)
            return;

        int rc;
        do {
            rc = zmq_ctx_destroy(ptr);
        } while (rc == -1 && errno == EINTR);

        ZMQ_ASSERT(rc == 0);
        ptr = ZMQ_NULLPTR;
    }